

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O0

UnicodeFunctor * __thiscall icu_63::RBBISymbolTable::lookupMatcher(RBBISymbolTable *this,UChar32 ch)

{
  RBBISymbolTable *This;
  UnicodeSet *retVal;
  UChar32 ch_local;
  RBBISymbolTable *this_local;
  
  This = (RBBISymbolTable *)0x0;
  if (ch == 0xffff) {
    This = (RBBISymbolTable *)this->fCachedSetLookup;
    this->fCachedSetLookup = (UnicodeSet *)0x0;
  }
  return (UnicodeFunctor *)This;
}

Assistant:

const UnicodeFunctor *RBBISymbolTable::lookupMatcher(UChar32 ch) const
{
    UnicodeSet *retVal = NULL;
    RBBISymbolTable *This = (RBBISymbolTable *)this;   // cast off const
    if (ch == 0xffff) {
        retVal = fCachedSetLookup;
        This->fCachedSetLookup = 0;
    }
    return retVal;
}